

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (zParam != (char *)0x0 && zFilename != (char *)0x0) {
    do {
      do {
        pcVar4 = zFilename;
        zFilename = pcVar4 + -1;
      } while (pcVar4[-1] != '\0');
    } while (((pcVar4[-2] != '\0') || (pcVar4[-3] != '\0')) || (pcVar4[-4] != '\0'));
    sVar2 = strlen(pcVar4);
    uVar3 = (ulong)((uint)sVar2 & 0x3fffffff);
    if (pcVar4[uVar3 + 1] != '\0') {
      pcVar4 = pcVar4 + uVar3 + 1;
      do {
        iVar1 = strcmp(pcVar4,zParam);
        sVar2 = strlen(pcVar4);
        pcVar4 = pcVar4 + (ulong)((uint)sVar2 & 0x3fffffff) + 1;
        if (iVar1 == 0) {
          return pcVar4;
        }
        sVar2 = strlen(pcVar4);
        pcVar4 = pcVar4 + (ulong)((uint)sVar2 & 0x3fffffff) + 1;
      } while (*pcVar4 != '\0');
    }
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename = databaseName(zFilename);
  return uriParameter(zFilename, zParam);
}